

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonEachNext(sqlite3_vtab_cursor *cur)

{
  JsonParse *pParse;
  char **ppcVar1;
  uint uVar2;
  uint uVar3;
  u32 uVar4;
  int iVar5;
  u32 uVar6;
  ulong in_RAX;
  sqlite3_vtab *psVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint *puVar13;
  bool bVar14;
  u32 sz;
  u32 sz_1;
  undefined8 local_38;
  
  pParse = (JsonParse *)(cur + 0x18);
  if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
    local_38 = in_RAX & 0xffffffff;
    uVar4 = jsonSkipLabel((JsonEachCursor *)cur);
    uVar6 = jsonbPayloadSize(pParse,uVar4,(u32 *)((long)&local_38 + 4));
    *(u32 *)((long)&cur[1].pVtab + 4) = uVar6 + uVar4 + local_38._4_4_;
    iVar5 = 0;
    goto LAB_001aeda8;
  }
  local_38 = in_RAX & 0xffffffff00000000;
  uVar3 = jsonSkipLabel((JsonEachCursor *)cur);
  bVar8 = *(byte *)((long)&(cur[0x18].pVtab)->pModule + (ulong)uVar3);
  uVar4 = jsonbPayloadSize(pParse,uVar3,(u32 *)&local_38);
  bVar14 = (byte)((bVar8 & 0xf) - 0xd) < 0xfe;
  if (bVar14) {
    uVar3 = uVar4 + uVar3 + (u32)local_38;
    *(uint *)((long)&cur[1].pVtab + 4) = uVar3;
    iVar9 = *(int *)((long)&cur[3].pVtab + 4);
    iVar5 = 0;
    if (iVar9 == 0) goto LAB_001aeda8;
LAB_001aed39:
    psVar7 = cur[5].pVtab;
    uVar12 = (ulong)(iVar9 - 1);
    if ((uint)psVar7[uVar12].nRef <= uVar3) {
      puVar13 = (uint *)&psVar7[uVar12].field_0xc;
      iVar11 = -iVar9;
      uVar10 = iVar9 - 2;
      do {
        uVar2 = *puVar13;
        if (iVar11 == -1) {
          *(undefined4 *)((long)&cur[3].pVtab + 4) = 0;
          cur[10].pVtab = (sqlite3_vtab *)(ulong)uVar2;
          goto LAB_001aeda3;
        }
        uVar12 = (ulong)uVar10;
        puVar13 = puVar13 + -6;
        iVar11 = iVar11 + 1;
        uVar10 = uVar10 - 1;
      } while ((uint)psVar7[uVar12].nRef <= uVar3);
      *(int *)((long)&cur[3].pVtab + 4) = -iVar11;
      cur[10].pVtab = (sqlite3_vtab *)(ulong)uVar2;
      bVar14 = false;
    }
    if (bVar14) goto LAB_001aeda8;
    bVar8 = pParse->aBlob[*(uint *)((long)&psVar7[uVar12].pModule + 4)] & 0xf;
  }
  else {
    uVar10 = *(uint *)((long)&cur[3].pVtab + 4);
    if (uVar10 < *(uint *)&cur[4].pVtab) {
      psVar7 = cur[5].pVtab;
    }
    else {
      uVar10 = *(uint *)&cur[4].pVtab * 2 + 3;
      psVar7 = (sqlite3_vtab *)
               sqlite3DbRealloc((sqlite3 *)cur[6].pVtab,cur[5].pVtab,(ulong)uVar10 * 0x18);
      if (psVar7 == (sqlite3_vtab *)0x0) {
        return 7;
      }
      *(uint *)&cur[4].pVtab = uVar10;
      cur[5].pVtab = psVar7;
      uVar10 = *(uint *)((long)&cur[3].pVtab + 4);
    }
    *(undefined4 *)&psVar7[uVar10].pModule = *(undefined4 *)((long)&cur[1].pVtab + 4);
    *(uint *)((long)&psVar7[uVar10].pModule + 4) = uVar3;
    uVar3 = uVar4 + uVar3;
    psVar7[uVar10].nRef = (u32)local_38 + uVar3;
    psVar7[uVar10].zErrMsg = (char *)0xffffffffffffffff;
    *(undefined4 *)&psVar7[uVar10].field_0xc = *(undefined4 *)&cur[10].pVtab;
    iVar5 = 0;
    if ((uVar10 != 0) && (*(char *)&cur[3].pVtab != '\0')) {
      jsonAppendPathName((JsonEachCursor *)cur);
      iVar5 = 7;
      if (*(char *)((long)&cur[0xb].pVtab + 1) == '\0') {
        iVar5 = 0;
      }
      uVar10 = *(uint *)((long)&cur[3].pVtab + 4);
    }
    iVar9 = uVar10 + 1;
    *(int *)((long)&cur[3].pVtab + 4) = iVar9;
    *(uint *)((long)&cur[1].pVtab + 4) = uVar3;
    if (iVar9 != 0) goto LAB_001aed39;
LAB_001aeda3:
    bVar8 = 0;
  }
  *(byte *)&cur[3].pVtab = bVar8;
LAB_001aeda8:
  if ((*(char *)&cur[3].pVtab == '\v') && (iVar9 = *(int *)((long)&cur[3].pVtab + 4), iVar9 != 0)) {
    ppcVar1 = &cur[5].pVtab[iVar9 - 1].zErrMsg;
    *ppcVar1 = *ppcVar1 + 1;
  }
  *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
  return iVar5;
}

Assistant:

static int jsonEachNext(sqlite3_vtab_cursor *cur){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  int rc = SQLITE_OK;
  if( p->bRecursive ){
    u8 x;
    u8 levelChange = 0;
    u32 n, sz = 0;
    u32 i = jsonSkipLabel(p);
    x = p->sParse.aBlob[i] & 0x0f;
    n = jsonbPayloadSize(&p->sParse, i, &sz);
    if( x==JSONB_OBJECT || x==JSONB_ARRAY ){
      JsonParent *pParent;
      if( p->nParent>=p->nParentAlloc ){
        JsonParent *pNew;
        u64 nNew;
        nNew = p->nParentAlloc*2 + 3;
        pNew = sqlite3DbRealloc(p->db, p->aParent, sizeof(JsonParent)*nNew);
        if( pNew==0 ) return SQLITE_NOMEM;
        p->nParentAlloc = (u32)nNew;
        p->aParent = pNew;
      }
      levelChange = 1;
      pParent = &p->aParent[p->nParent];
      pParent->iHead = p->i;
      pParent->iValue = i;
      pParent->iEnd = i + n + sz;
      pParent->iKey = -1;
      pParent->nPath = (u32)p->path.nUsed;
      if( p->eType && p->nParent ){
        jsonAppendPathName(p);
        if( p->path.eErr ) rc = SQLITE_NOMEM;
      }
      p->nParent++;
      p->i = i + n;
    }else{
      p->i = i + n + sz;
    }
    while( p->nParent>0 && p->i >= p->aParent[p->nParent-1].iEnd ){
      p->nParent--;
      p->path.nUsed = p->aParent[p->nParent].nPath;
      levelChange = 1;
    }
    if( levelChange ){
      if( p->nParent>0 ){
        JsonParent *pParent = &p->aParent[p->nParent-1];
        u32 iVal = pParent->iValue;
        p->eType = p->sParse.aBlob[iVal] & 0x0f;
      }else{
        p->eType = 0;
      }
    }
  }else{
    u32 n, sz = 0;
    u32 i = jsonSkipLabel(p);
    n = jsonbPayloadSize(&p->sParse, i, &sz);
    p->i = i + n + sz;
  }
  if( p->eType==JSONB_ARRAY && p->nParent ){
    p->aParent[p->nParent-1].iKey++;
  }
  p->iRowid++;
  return rc;
}